

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlistmodel.cpp
# Opt level: O2

void __thiscall QStringListModel::sort(QStringListModel *this,int param_1,SortOrder order)

{
  qsizetype qVar1;
  int iVar2;
  iterator __first;
  iterator __last;
  pointer piVar3;
  code *__comp;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  Data *local_d8;
  QPersistentModelIndex *pQStack_d0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_c8;
  QArrayDataPointer<QModelIndex> local_b8;
  QArrayDataPointer<QModelIndex> local_98;
  QArrayDataPointer<int> local_78;
  QArrayDataPointer<std::pair<QString,_int>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (pair<QString,_int> *)0x0;
  local_58.size = 0;
  QAbstractItemModel::layoutAboutToBeChanged
            ((QAbstractItemModel *)this,(QList<QPersistentModelIndex> *)&local_58,VerticalSortHint);
  QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
            ((QArrayDataPointer<QPersistentModelIndex> *)&local_58);
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (pair<QString,_int> *)0x0;
  uVar5 = *(ulong *)(this + 0x20);
  iVar4 = (int)uVar5;
  QList<std::pair<QString,_int>_>::reserve((QList<std::pair<QString,_int>_> *)&local_58,(long)iVar4)
  ;
  iVar2 = 0;
  while (local_78.d = (Data *)CONCAT44(local_78.d._4_4_,iVar2), iVar2 < iVar4) {
    QList<std::pair<QString,int>>::emplaceBack<QString_const&,int&>
              ((QList<std::pair<QString,int>> *)&local_58,
               (QString *)((long)iVar2 * 0x18 + *(long *)(this + 0x18)),(int *)&local_78);
    iVar2 = (int)local_78.d + 1;
  }
  if (order == AscendingOrder) {
    __first = QList<std::pair<QString,_int>_>::begin((QList<std::pair<QString,_int>_> *)&local_58);
    __last = QList<std::pair<QString,_int>_>::end((QList<std::pair<QString,_int>_> *)&local_58);
    __comp = ascendingLessThan;
  }
  else {
    __first = QList<std::pair<QString,_int>_>::begin((QList<std::pair<QString,_int>_> *)&local_58);
    __last = QList<std::pair<QString,_int>_>::end((QList<std::pair<QString,_int>_> *)&local_58);
    __comp = decendingLessThan;
  }
  std::
  __sort<QList<std::pair<QString,int>>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<QString,int>const&,std::pair<QString,int>const&)>>
            (__first,__last,
             (_Iter_comp_iter<bool_(*)(const_std::pair<QString,_int>_&,_const_std::pair<QString,_int>_&)>
              )__comp);
  QList<QString>::clear((QList<QString> *)(this + 0x10));
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  QList<int>::QList((QList<int> *)&local_78,(long)iVar4);
  uVar7 = 0;
  uVar5 = uVar5 & 0xffffffff;
  if (iVar4 < 1) {
    uVar5 = uVar7;
  }
  for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    QList<QString>::emplaceBack<QString_const&>
              ((QList<QString> *)(this + 0x10),
               (QString *)((long)&((local_58.ptr)->first).d.d + uVar7));
    iVar2 = *(int *)((long)&(local_58.ptr)->second + uVar7);
    piVar3 = QList<int>::data((QList<int> *)&local_78);
    piVar3[iVar2] = (int)uVar6;
    uVar7 = uVar7 + 0x20;
  }
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemModel::persistentIndexList((QModelIndexList *)&local_98,(QAbstractItemModel *)this);
  qVar1 = local_98.size;
  local_b8.size = 0;
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (QModelIndex *)0x0;
  iVar2 = (int)local_98.size;
  QList<QModelIndex>::reserve((QList<QModelIndex> *)&local_b8,(long)iVar2);
  uVar7 = 0;
  uVar5 = qVar1 & 0xffffffff;
  if (iVar2 < 1) {
    uVar5 = uVar7;
  }
  for (; uVar5 * 0x18 - uVar7 != 0; uVar7 = uVar7 + 0x18) {
    local_f0 = 0xffffffffffffffff;
    local_e8 = 0;
    uStack_e0 = 0;
    (**(code **)(*(long *)this + 0x60))
              ((QModelIndex *)&local_d8,this,
               local_78.ptr[*(int *)((long)&(local_98.ptr)->r + uVar7)],0,&local_f0);
    QList<QModelIndex>::emplaceBack<QModelIndex>
              ((QList<QModelIndex> *)&local_b8,(QModelIndex *)&local_d8);
  }
  QAbstractItemModel::changePersistentIndexList
            ((QAbstractItemModel *)this,(QModelIndexList *)&local_98,(QModelIndexList *)&local_b8);
  local_d8 = (Data *)0x0;
  pQStack_d0 = (QPersistentModelIndex *)0x0;
  local_c8.ptr = (QAbstractItemModel *)0x0;
  QAbstractItemModel::layoutChanged
            ((QAbstractItemModel *)this,(QList<QPersistentModelIndex> *)&local_d8,VerticalSortHint);
  QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
            ((QArrayDataPointer<QPersistentModelIndex> *)&local_d8);
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_b8);
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<std::pair<QString,_int>_>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStringListModel::sort(int, Qt::SortOrder order)
{
    emit layoutAboutToBeChanged(QList<QPersistentModelIndex>(), VerticalSortHint);

    QList<std::pair<QString, int>> list;
    const int lstCount = lst.size();
    list.reserve(lstCount);
    for (int i = 0; i < lstCount; ++i)
        list.emplace_back(lst.at(i), i);

    if (order == Qt::AscendingOrder)
        std::sort(list.begin(), list.end(), ascendingLessThan);
    else
        std::sort(list.begin(), list.end(), decendingLessThan);

    lst.clear();
    QList<int> forwarding(lstCount);
    for (int i = 0; i < lstCount; ++i) {
        lst.append(list.at(i).first);
        forwarding[list.at(i).second] = i;
    }

    QModelIndexList oldList = persistentIndexList();
    QModelIndexList newList;
    const int numOldIndexes = oldList.size();
    newList.reserve(numOldIndexes);
    for (int i = 0; i < numOldIndexes; ++i)
        newList.append(index(forwarding.at(oldList.at(i).row()), 0));
    changePersistentIndexList(oldList, newList);

    emit layoutChanged(QList<QPersistentModelIndex>(), VerticalSortHint);
}